

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rcdiscover::WOL::appendMagicPacket
          (WOL *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sendbuf,
          array<unsigned_char,_4UL> *password)

{
  value_type_conflict1 *pvVar1;
  long in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int i_2;
  size_t j;
  int i_1;
  int i;
  value_type_conflict1 *in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  value_type_conflict1 *in_stack_ffffffffffffffb8;
  int local_34;
  value_type_conflict1 *local_30;
  int local_24;
  int local_1c;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    local_30 = (value_type_conflict1 *)0x0;
    while (in_stack_ffffffffffffffb8 = local_30,
          pvVar1 = (value_type_conflict1 *)
                   std::array<unsigned_char,_6UL>::size((array<unsigned_char,_6UL> *)in_RDI),
          in_stack_ffffffffffffffb8 < pvVar1) {
      in_stack_ffffffffffffffb0 = in_RSI;
      std::array<unsigned_char,_6UL>::operator[]
                ((array<unsigned_char,_6UL> *)in_RSI,(size_type)in_stack_ffffffffffffffa8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_RDI,in_stack_ffffffffffffffb8);
      local_30 = local_30 + 1;
    }
  }
  if (in_RDX != 0) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)in_stack_ffffffffffffffb0,(size_type)in_RSI);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_RDI,in_stack_ffffffffffffffb8);
    }
  }
  return in_RSI;
}

Assistant:

std::vector<uint8_t>& WOL::appendMagicPacket(
    std::vector<uint8_t>& sendbuf,
    const std::array<uint8_t, 4> *password) const
{
  for (int i = 0; i < 6; ++i)
  {
    sendbuf.push_back(0xFF);
  }
  for (int i = 0; i < 16; ++i)
  {
    for (size_t j = 0; j < hardware_addr_.size(); ++j)
    {
      sendbuf.push_back(hardware_addr_[j]);
    }
  }
  if (password != nullptr)
  {
    for (int i = 0; i < 4; ++i)
    {
      sendbuf.push_back((*password)[i]);
    }
  }

  return sendbuf;
}